

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream.cpp
# Opt level: O3

XmlStringRef * __thiscall
QXmlStreamReaderPrivate::namespaceForPrefix
          (XmlStringRef *__return_storage_ptr__,QXmlStreamReaderPrivate *this,QStringView prefix)

{
  NamespaceDeclaration *pNVar1;
  qsizetype qVar2;
  long lVar3;
  bool bVar4;
  undefined8 *puVar5;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 aVar6;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 aVar7;
  XmlStringRef *lhs;
  long lVar8;
  long in_FS_OFFSET;
  QStringView rhs;
  QAnyStringView a;
  QString local_68;
  QString local_50;
  long local_38;
  
  aVar6 = (anon_union_8_3_8ad491a7_for_QAnyStringView_6)prefix.m_data;
  lhs = (XmlStringRef *)prefix.m_size;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pNVar1 = (this->super_QXmlStreamPrivateTagStack).namespaceDeclarations.data;
  aVar7 = aVar6;
  lVar3 = (this->super_QXmlStreamPrivateTagStack).namespaceDeclarations.tos * 0x30;
  do {
    lVar8 = lVar3;
    if (lVar8 == -0x30) {
      if (lhs != (XmlStringRef *)0x0 && (this->field_0x3a9 & 0x10) != 0) {
        QCoreApplication::translate
                  (&local_68,"QXmlStream","Namespace prefix \'%1\' not declared",(char *)0x0,-1);
        a.m_size = (ulong)lhs | 0x8000000000000000;
        a.field_0.m_data = aVar6.m_data;
        QString::arg_impl(&local_50,&local_68,a,0,(QChar)0x20);
        this->error = NotWellFormedError;
        QString::operator=(&this->errorString,&local_50);
        this->type = Invalid;
        if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
          }
        }
        if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,2,0x10);
          }
        }
      }
      __return_storage_ptr__->m_string = (QString *)0x0;
      __return_storage_ptr__->m_pos = 0;
      __return_storage_ptr__->m_size = 0;
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return __return_storage_ptr__;
      }
      goto LAB_00395e23;
    }
    rhs.m_data = (storage_type_conflict *)aVar7.m_data;
    rhs.m_size = (qsizetype)aVar6.m_data;
    bVar4 = QtPrivate::operator==((QtPrivate *)((long)&(pNVar1->prefix).m_string + lVar8),lhs,rhs);
    lVar3 = lVar8 + -0x30;
  } while (!bVar4);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    puVar5 = (undefined8 *)((long)&(pNVar1->namespaceUri).m_string + lVar8);
    __return_storage_ptr__->m_size = puVar5[2];
    qVar2 = puVar5[1];
    __return_storage_ptr__->m_string = (QString *)*puVar5;
    __return_storage_ptr__->m_pos = qVar2;
    return __return_storage_ptr__;
  }
LAB_00395e23:
  __stack_chk_fail();
}

Assistant:

XmlStringRef QXmlStreamReaderPrivate::namespaceForPrefix(QStringView prefix)
{
     for (const NamespaceDeclaration &namespaceDeclaration : reversed(namespaceDeclarations)) {
         if (namespaceDeclaration.prefix == prefix) {
             return namespaceDeclaration.namespaceUri;
         }
     }

#if 1
     if (namespaceProcessing && !prefix.isEmpty())
         raiseWellFormedError(QXmlStream::tr("Namespace prefix '%1' not declared").arg(prefix));
#endif

     return XmlStringRef();
}